

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O3

void isFuncMatchCpStr(attr *exp,char *buf)

{
  int iVar1;
  size_t sVar2;
  char buf2 [32];
  char acStack_38 [40];
  
  if (exp != (attr *)0x0) {
    do {
      iVar1 = exp->kind;
      if (iVar1 != 3) {
        if (iVar1 == 2) {
          sVar2 = strlen(buf);
          builtin_strncpy(buf + sVar2,"struct ",8);
          strcat(buf,((exp->field_1).basic)->name);
          return;
        }
        if (iVar1 == 1) {
          isFuncMatchCpStr(((exp->field_1).array)->type,buf);
          sprintf(acStack_38,"[%d]",(ulong)(uint)((exp->field_1).basic)->type);
          strcat(buf,acStack_38);
          return;
        }
        if (iVar1 != 0) {
          return;
        }
        iVar1 = ((exp->field_1).basic)->type;
        if (iVar1 != 5) {
          if (iVar1 != 2) {
            return;
          }
          sVar2 = strlen(buf);
          builtin_strncpy(buf + sVar2,"int",4);
          return;
        }
        sVar2 = strlen(buf);
        builtin_strncpy(buf + sVar2,"float",6);
        return;
      }
      exp = ((exp->field_1).function)->return_type;
    } while (exp != (attr *)0x0);
  }
  return;
}

Assistant:

static void isFuncMatchCpStr(struct attr *exp, char *buf) {
    if (!exp)
        return;
    switch (exp->kind) {
        case BASIC:
            switch (exp->basic->type) {
                case INT_T:
                    strcat(buf, "int");
                    break;
                case FLOAT_T:
                    strcat(buf, "float");
                    break;
                default:
                    break;
            }
            break;
        case STRUCTURE:
            strcat(buf, "struct ");
            strcat(buf, exp->structure->name);
            break;
        case ARRAY: {
            char buf2[32];
            isFuncMatchCpStr(exp->array->type, buf);
            sprintf(buf2, "[%d]", exp->array->size);
            strcat(buf, buf2);
            break;
        }
        case FUNCTION:
            isFuncMatchCpStr(exp->function->return_type, buf);
            break;
        default:
            //DONETODO: check more type
            break;
    }
}